

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall
AmpIO::ReadCollectionStatus(AmpIO *this,bool *collecting,uchar *chan,unsigned_short *writeAddr)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  uint uVar3;
  uint local_34;
  bool ret;
  unsigned_short *puStack_30;
  quadlet_t read_data;
  unsigned_short *writeAddr_local;
  uchar *chan_local;
  bool *collecting_local;
  AmpIO *this_local;
  
  puStack_30 = writeAddr;
  writeAddr_local = (unsigned_short *)chan;
  chan_local = collecting;
  collecting_local = (bool *)this;
  uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar2 < 7) {
    this_local._7_1_ = false;
  }
  else {
    uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar2 == 0x44514c41) {
      this_local._7_1_ = false;
    }
    else {
      pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
      uVar3 = (*pBVar1->_vptr_BasePort[0x23])
                        (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,0x7800,&local_34);
      this_local._7_1_ = (bool)((byte)uVar3 & 1);
      if ((uVar3 & 1) != 0) {
        *chan_local = (local_34 & 0x8000) != 0;
        *(char *)writeAddr_local = (char)((local_34 & 0x3c00) >> 10);
        *puStack_30 = (ushort)local_34 & 0x3ff;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::ReadCollectionStatus(bool &collecting, unsigned char &chan, unsigned short &writeAddr) const
{
    if (GetFirmwareVersion() < 7) return false;
    if (GetHardwareVersion() == DQLA_String)
        return false;

    quadlet_t read_data;
    bool ret = port->ReadQuadlet(BoardId, 0x7800, read_data);
    if (ret) {
        collecting = (read_data&0x00008000);
        chan = (read_data&0x00003c00)>>10;
        writeAddr = (read_data&0x000003ff);
    }
    return ret;
}